

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_Constructor_type_Test::TestBody(AddressFactory_Constructor_type_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_7c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b8;
  AssertionResult gtest_ar;
  AddressFactory factory_7;
  Pubkey pubkey;
  AddressFactory factory;
  Pubkey local_5e8 [15];
  Pubkey local_470 [15];
  Pubkey local_2f8 [15];
  Pubkey local_180 [15];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory,kMainnet);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2b,
               "Expected: AddressFactory factory(NetType::kMainnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_7,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory,kTestnet);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2c,
               "Expected: AddressFactory factory(NetType::kTestnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_7,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory,kRegtest);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2d,
               "Expected: AddressFactory factory(NetType::kRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_7,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory,kLiquidV1);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2e,
               "Expected: AddressFactory factory(NetType::kLiquidV1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_7,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory,kElementsRegtest);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2f,
               "Expected: AddressFactory factory(NetType::kElementsRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_7,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory,kCustomChain);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x30,
               "Expected: AddressFactory factory(NetType::kCustomChain) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_7,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory,kCustomChain);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x31,
               "Expected: AddressFactory factory(NetType::kNetTypeNum) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_7,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  std::__cxx11::string::string
            ((string *)&factory,"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af"
             ,(allocator *)&factory_7);
  cfd::core::Pubkey::Pubkey(&pubkey,(string *)&factory);
  std::__cxx11::string::~string((string *)&factory);
  cfd::AddressFactory::AddressFactory(&factory_7,kMainnet);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)&factory);
  local_7b8.ptr_._0_4_ = factory._vptr_AddressFactory._0_4_;
  local_7c0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kMainnet",(NetType *)&local_7b8,
             (NetType *)&local_7c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_7b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_7b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_7b8.ptr_._0_4_ = factory.type_;
  local_7c0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7b8,(WitnessVersion *)&local_7c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_7b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_7b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_7);
  cfd::AddressFactory::AddressFactory(&factory_7,kTestnet);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)&factory);
  local_7b8.ptr_._0_4_ = factory._vptr_AddressFactory._0_4_;
  local_7c0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kTestnet",(NetType *)&local_7b8,
             (NetType *)&local_7c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_7b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_7b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_7b8.ptr_._0_4_ = factory.type_;
  local_7c0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7b8,(WitnessVersion *)&local_7c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_7b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_7b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_7);
  cfd::AddressFactory::AddressFactory(&factory_7,kRegtest);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)&factory);
  local_7b8.ptr_._0_4_ = factory._vptr_AddressFactory._0_4_;
  local_7c0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kRegtest",(NetType *)&local_7b8,
             (NetType *)&local_7c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_7b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_7b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_7b8.ptr_._0_4_ = factory.type_;
  local_7c0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7b8,(WitnessVersion *)&local_7c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_7b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_7b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_7);
  cfd::AddressFactory::AddressFactory(&factory,kLiquidV1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(local_180);
    cfd::core::Address::~Address((Address *)local_180);
  }
  testing::Message::Message((Message *)&factory_7);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x49,
             "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_7);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_7);
  cfd::AddressFactory::~AddressFactory(&factory);
  cfd::AddressFactory::AddressFactory(&factory,kElementsRegtest);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(local_2f8);
    cfd::core::Address::~Address((Address *)local_2f8);
  }
  testing::Message::Message((Message *)&factory_7);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x4d,
             "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_7);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_7);
  cfd::AddressFactory::~AddressFactory(&factory);
  cfd::AddressFactory::AddressFactory(&factory,kCustomChain);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(local_470);
    cfd::core::Address::~Address((Address *)local_470);
  }
  testing::Message::Message((Message *)&factory_7);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x51,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_7);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_7);
  cfd::AddressFactory::~AddressFactory(&factory);
  cfd::AddressFactory::AddressFactory(&factory,kCustomChain);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(local_5e8);
    cfd::core::Address::~Address((Address *)local_5e8);
  }
  testing::Message::Message((Message *)&factory_7);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x55,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_7);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_7);
  cfd::AddressFactory::~AddressFactory(&factory);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kLiquidV1));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kElementsRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kCustomChain));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kNetTypeNum));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");

  {
    AddressFactory factory(NetType::kMainnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kLiquidV1);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kCustomChain);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kNetTypeNum);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}